

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.h
# Opt level: O3

bool __thiscall
flatbuffers::BinaryAnnotator::IsValidUnionValue(BinaryAnnotator *this,Field *field,uint8_t value)

{
  Schema *pSVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  Field *pFVar8;
  
  bVar5 = IsUnionType(this,field);
  if (bVar5) {
    if ((*(ushort *)(field + -(long)*(int *)field) < 7) ||
       (uVar7 = (ulong)*(ushort *)(field + (6 - (long)*(int *)field)), uVar7 == 0)) {
      pFVar8 = (Field *)0x0;
    }
    else {
      pFVar8 = field + *(uint *)(field + uVar7) + uVar7;
    }
    uVar6 = 0xffffffff;
    if ((8 < *(ushort *)(pFVar8 + -(long)*(int *)pFVar8)) &&
       ((ulong)*(ushort *)(pFVar8 + (8 - (long)*(int *)pFVar8)) != 0)) {
      uVar6 = *(uint *)(pFVar8 + *(ushort *)(pFVar8 + (8 - (long)*(int *)pFVar8)));
    }
    pSVar1 = this->schema_;
    uVar7 = (ulong)*(ushort *)(pSVar1 + (6 - (long)*(int *)pSVar1));
    if (uVar6 < *(uint *)(pSVar1 + *(uint *)(pSVar1 + uVar7) + uVar7)) {
      lVar2 = *(uint *)(pSVar1 + uVar7) + uVar7;
      lVar3 = (ulong)(uVar6 << 2) + lVar2;
      lVar4 = (ulong)*(uint *)(pSVar1 + (ulong)(uVar6 << 2) + lVar2 + 4) + lVar3 + 4;
      return (uint)value <
             *(uint *)(pSVar1 + (ulong)*(uint *)(pSVar1 + (ulong)*(ushort *)
                                                                  (pSVar1 + (lVar4 - *(int *)(pSVar1
                                                                                             + (
                                                  ulong)*(uint *)(pSVar1 + (ulong)(uVar6 << 2) +
                                                                           lVar2 + 4) + 4 + lVar3))
                                                  + 6) + lVar4) +
                                (ulong)*(ushort *)
                                        (pSVar1 + (lVar4 - *(int *)(pSVar1 + (ulong)*(uint *)(pSVar1
                                                                                             + (
                                                  ulong)(uVar6 << 2) + lVar2 + 4) + 4 + lVar3)) + 6)
                                + lVar4);
    }
  }
  return false;
}

Assistant:

bool IsValidUnionValue(const reflection::Field *const field,
                         const uint8_t value) {
    return IsUnionType(field) &&
           IsValidUnionValue(field->type()->index(), value);
  }